

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack10_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x3ff;
  auVar3 = vpbroadcastd_avx512vl();
  auVar5._8_8_ = 0x140000000a;
  auVar5._0_8_ = 0x140000000a;
  auVar3 = vpsrlvd_avx2(auVar3,auVar5);
  auVar4._8_4_ = 0x3ff;
  auVar4._0_8_ = 0x3ff000003ff;
  auVar4._12_4_ = 0x3ff;
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 1) = auVar3._0_8_;
  uVar2 = in[1];
  out[3] = uVar1 >> 0x1e;
  out[3] = uVar1 >> 0x1e | (uVar2 & 0xff) << 2;
  auVar3 = vpbroadcastd_avx512vl();
  auVar6._8_8_ = 0x1200000008;
  auVar6._0_8_ = 0x1200000008;
  auVar3 = vpsrlvd_avx2(auVar3,auVar6);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 4) = auVar3._0_8_;
  out[6] = uVar2 >> 0x1c;
  uVar1 = in[2];
  out[6] = uVar2 >> 0x1c | (uVar1 & 0x3f) << 4;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a43c0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 7) = auVar3._0_8_;
  out[9] = uVar1 >> 0x1a;
  uVar2 = in[3];
  out[9] = uVar1 >> 0x1a | (uVar2 & 0xf) << 6;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a43d0);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 10) = auVar3._0_8_;
  uVar1 = in[4];
  out[0xc] = uVar2 >> 0x18;
  out[0xc] = uVar2 >> 0x18 | (uVar1 & 3) << 8;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a43e0);
  uVar2 = in[5];
  auVar7 = vpinsrd_avx(auVar3,uVar1,2);
  auVar3 = vpinsrd_avx(auVar7,uVar2,3);
  auVar3 = vpand_avx(auVar3,auVar4);
  auVar7 = vpsrld_avx(auVar7,0x16);
  auVar3 = vpblendd_avx2(auVar3,auVar7,4);
  *(undefined1 (*) [16])(out + 0xd) = auVar3;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,auVar5);
  auVar3 = vpand_avx(auVar3,auVar4);
  uVar1 = in[6];
  *(long *)(out + 0x11) = auVar3._0_8_;
  out[0x13] = uVar2 >> 0x1e;
  out[0x13] = uVar2 >> 0x1e | (uVar1 & 0xff) << 2;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,auVar6);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0x14) = auVar3._0_8_;
  out[0x16] = uVar1 >> 0x1c;
  uVar2 = in[7];
  out[0x16] = uVar1 >> 0x1c | (uVar2 & 0x3f) << 4;
  out[0x17] = uVar2 >> 6 & 0x3ff;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack10_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;
  *out = ((*in) >> 16) % (1U << 10);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 4)) << (10 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 10);
  out++;
  *out = ((*in) >> 14) % (1U << 10);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 2)) << (10 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 10);
  out++;
  *out = ((*in) >> 12) % (1U << 10);
  out++;
  *out = ((*in) >> 22);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;

  return in + 1;
}